

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall
Hospital::Password_Validate
          (Hospital *this,string *password,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  bool bVar1;
  ostream *this_00;
  string *this_01;
  string password_1;
  vector<Patient,_std::allocator<Patient>_> local_b0;
  vector<Doctor,_std::allocator<Doctor>_> local_98;
  vector<Nurse,_std::allocator<Nurse>_> local_80;
  string local_58 [32];
  vector<Patient,_std::allocator<Patient>_> *local_38;
  vector<Patient,_std::allocator<Patient>_> *All_Of_Patients_local;
  vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors_local;
  vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses_local;
  string *password_local;
  Hospital *this_local;
  
  local_38 = All_Of_Patients;
  All_Of_Patients_local = (vector<Patient,_std::allocator<Patient>_> *)All_Of_Doctors;
  All_Of_Doctors_local = (vector<Doctor,_std::allocator<Doctor>_> *)All_Of_Nurses;
  All_Of_Nurses_local = (vector<Nurse,_std::allocator<Nurse>_> *)password;
  password_local = &this->Admin_Username;
  std::__cxx11::string::string(local_58,(string *)password);
  std::vector<Nurse,_std::allocator<Nurse>_>::vector(&local_80,All_Of_Nurses);
  std::vector<Doctor,_std::allocator<Doctor>_>::vector(&local_98,All_Of_Doctors);
  std::vector<Patient,_std::allocator<Patient>_>::vector(&local_b0,All_Of_Patients);
  bVar1 = Existence_Of_Password(this,(string *)local_58,&local_80,&local_98,&local_b0);
  std::vector<Patient,_std::allocator<Patient>_>::~vector(&local_b0);
  std::vector<Doctor,_std::allocator<Doctor>_>::~vector(&local_98);
  std::vector<Nurse,_std::allocator<Nurse>_>::~vector(&local_80);
  std::__cxx11::string::~string(local_58);
  if (!bVar1) {
    this_01 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(this_01,(string *)password);
    __cxa_throw(this_01,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  this_00 = std::operator<<((ostream *)&std::cout,"This password already exists !!!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool Hospital :: Password_Validate(string password , vector<Nurse> All_Of_Nurses , vector<Doctor> All_Of_Doctors , vector<Patient>All_Of_Patients) {
    try {
        if (Existence_Of_Password (password,All_Of_Nurses , All_Of_Doctors ,All_Of_Patients )) {
            cout << "This password already exists !!!"<<endl;   ///add bool func to search in file and check existence of user_name
            return false;
        }
        else throw password;
    }
    catch(string password) {
        cout << "your password  entered successfully ."<<endl;
        return true;
    }
}